

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Div::applyPoint
          (Interval *__return_storage_ptr__,Div *this,EvalContext *ctx,double x,double y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  Interval dst;
  Interval local_30;
  uint uVar13;
  
  FloatFunc2::applyPoint(__return_storage_ptr__,(FloatFunc2 *)this,ctx,x,y);
  if ((x < -1.79769313486232e+308 != x <= 1.79769313486232e+308) &&
     (((y != 0.0 || (NAN(y))) && (y <= 1.79769313486232e+308 != y < -1.79769313486232e+308)))) {
    tcu::FloatFormat::convert(&local_30,&ctx->format,__return_storage_ptr__);
    if ((local_30.m_lo <= -INFINITY) && (!NAN(local_30.m_hi))) {
      dVar7 = (ctx->format).m_maxValue;
      __return_storage_ptr__->m_hasNaN = (bool)(__return_storage_ptr__->m_hasNaN & 1U | NAN(dVar7));
      uVar4 = (uint)NAN(dVar7);
      uVar13 = (uint)((long)((ulong)uVar4 << 0x3f) >> 0x3f);
      auVar2._4_8_ = 0;
      auVar2._0_4_ = uVar13;
      auVar11._0_12_ = auVar2 << 0x20;
      auVar11._12_4_ = (int)((long)((ulong)uVar4 << 0x3f) >> 0x3f);
      auVar14._4_4_ = uVar13;
      auVar14._0_4_ = uVar13;
      auVar14._8_4_ = auVar11._12_4_;
      auVar14._12_4_ = auVar11._12_4_;
      auVar12._0_8_ = -dVar7;
      auVar12._8_8_ = -dVar7;
      auVar12 = auVar11 & _DAT_01b93930 | ~auVar14 & auVar12;
      dVar10 = auVar12._8_8_;
      dVar7 = auVar12._0_8_;
      uVar5 = -(ulong)(__return_storage_ptr__->m_lo <= dVar7);
      uVar6 = -(ulong)(dVar10 <= __return_storage_ptr__->m_hi);
      __return_storage_ptr__->m_lo =
           (double)(~uVar5 & (ulong)dVar7 | (ulong)__return_storage_ptr__->m_lo & uVar5);
      __return_storage_ptr__->m_hi =
           (double)(~uVar6 & (ulong)dVar10 | (ulong)__return_storage_ptr__->m_hi & uVar6);
    }
    if ((!NAN(local_30.m_lo)) && (INFINITY <= local_30.m_hi)) {
      dVar7 = (ctx->format).m_maxValue;
      __return_storage_ptr__->m_hasNaN = (bool)(__return_storage_ptr__->m_hasNaN & 1U | NAN(dVar7));
      uVar4 = (uint)NAN(dVar7);
      uVar13 = (uint)((long)((ulong)uVar4 << 0x3f) >> 0x3f);
      auVar3._4_8_ = 0;
      auVar3._0_4_ = uVar13;
      auVar8._0_12_ = auVar3 << 0x20;
      auVar8._12_4_ = (int)((long)((ulong)uVar4 << 0x3f) >> 0x3f);
      auVar9._4_4_ = uVar13;
      auVar9._0_4_ = uVar13;
      auVar9._8_4_ = auVar8._12_4_;
      auVar9._12_4_ = auVar8._12_4_;
      auVar1._8_8_ = dVar7;
      auVar1._0_8_ = dVar7;
      auVar12 = auVar8 & _DAT_01b93930 | ~auVar9 & auVar1;
      dVar10 = auVar12._8_8_;
      dVar7 = auVar12._0_8_;
      uVar5 = -(ulong)(__return_storage_ptr__->m_lo <= dVar7);
      uVar6 = -(ulong)(dVar10 <= __return_storage_ptr__->m_hi);
      __return_storage_ptr__->m_lo =
           (double)(~uVar5 & (ulong)dVar7 | (ulong)__return_storage_ptr__->m_lo & uVar5);
      __return_storage_ptr__->m_hi =
           (double)(~uVar6 & (ulong)dVar10 | (ulong)__return_storage_ptr__->m_hi & uVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint		(const EvalContext&	ctx, double x, double y) const
	{
		Interval ret = FloatFunc2::applyPoint(ctx, x, y);

		if (!deIsInf(x) && !deIsInf(y) && y != 0.0)
		{
			const Interval dst = ctx.format.convert(ret);
			if (dst.contains(-TCU_INFINITY)) ret |= -ctx.format.getMaxValue();
			if (dst.contains(+TCU_INFINITY)) ret |= +ctx.format.getMaxValue();
		}

		return ret;
	}